

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_sequences.c
# Opt level: O0

size_t ZSTD_entropyCost(uint *count,uint max,size_t total)

{
  uint local_2c;
  uint local_28;
  uint norm;
  uint s;
  uint cost;
  size_t total_local;
  uint max_local;
  uint *count_local;
  
  norm = 0;
  for (local_28 = 0; local_28 <= max; local_28 = local_28 + 1) {
    local_2c = (uint)((count[local_28] << 8) / total);
    if ((count[local_28] != 0) && (local_2c == 0)) {
      local_2c = 1;
    }
    norm = count[local_28] * kInverseProbabilityLog256[local_2c] + norm;
  }
  return (ulong)(norm >> 8);
}

Assistant:

static size_t ZSTD_entropyCost(unsigned const* count, unsigned const max, size_t const total)
{
    unsigned cost = 0;
    unsigned s;

    assert(total > 0);
    for (s = 0; s <= max; ++s) {
        unsigned norm = (unsigned)((256 * count[s]) / total);
        if (count[s] != 0 && norm == 0)
            norm = 1;
        assert(count[s] < total);
        cost += count[s] * kInverseProbabilityLog256[norm];
    }
    return cost >> 8;
}